

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O2

bool jpge::compress_image_to_jpeg_file_in_memory
               (void *pDstBuf,int *buf_size,int width,int height,int num_channels,uint8 *pImage_data
               ,params *comp_params)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  memory_stream dst_stream;
  jpeg_encoder dst_image;
  undefined **local_3500;
  void *local_34f8;
  int local_34f0;
  int local_34ec;
  jpeg_encoder local_34e8;
  
  local_34f0 = *buf_size;
  if (local_34f0 == 0 || pDstBuf == (void *)0x0) {
    bVar1 = false;
  }
  else {
    local_3500 = &PTR__output_stream_001b65d8;
    local_34ec = 0;
    *buf_size = 0;
    local_34e8.m_params.m_quality = 0x55;
    local_34e8.m_params.m_subsampling = H2V2;
    local_34e8.m_params.m_no_chroma_discrim_flag = false;
    local_34e8.m_params.m_two_pass_flag = false;
    local_34e8.m_mcu_lines[0] = (uint8 *)0x0;
    local_34e8.m_pass_num = '\0';
    local_34e8.m_all_stream_writes_succeeded = true;
    local_34f8 = pDstBuf;
    iVar3 = jpeg_encoder::init(&local_34e8,(EVP_PKEY_CTX *)&local_3500);
    uVar4 = 0;
    bVar1 = false;
    if ((char)iVar3 != '\0') {
      if (height < 1) {
        height = 0;
      }
      do {
        if (local_34e8.m_params.m_two_pass_flag + 1 <= uVar4) {
          crnlib::crnlib_free(local_34e8.m_mcu_lines[0]);
          local_34e8.m_mcu_lines[0] = (uint8 *)0x0;
          local_34e8.m_pass_num = '\0';
          local_34e8.m_all_stream_writes_succeeded = true;
          *buf_size = local_34ec;
          bVar1 = true;
          break;
        }
        iVar3 = 0;
        lVar5 = (ulong)(uint)height + 1;
        while (lVar5 = lVar5 + -1, lVar5 != 0) {
          bVar1 = jpeg_encoder::process_scanline(&local_34e8,pImage_data + iVar3);
          iVar3 = iVar3 + num_channels * width;
          if (!bVar1) {
            bVar1 = false;
            goto LAB_00125055;
          }
        }
        bVar2 = jpeg_encoder::process_scanline(&local_34e8,(void *)0x0);
        uVar4 = uVar4 + 1;
        bVar1 = false;
      } while (bVar2);
    }
LAB_00125055:
    jpeg_encoder::~jpeg_encoder(&local_34e8);
  }
  return bVar1;
}

Assistant:

bool compress_image_to_jpeg_file_in_memory(void* pDstBuf, int& buf_size, int width, int height, int num_channels, const uint8* pImage_data, const params& comp_params) {
  if ((!pDstBuf) || (!buf_size))
    return false;

  memory_stream dst_stream(pDstBuf, buf_size);

  buf_size = 0;

  jpge::jpeg_encoder dst_image;
  if (!dst_image.init(&dst_stream, width, height, num_channels, comp_params))
    return false;

  for (uint pass_index = 0; pass_index < dst_image.get_total_passes(); pass_index++) {
    for (int i = 0; i < height; i++) {
      const uint8* pScanline = pImage_data + i * width * num_channels;
      if (!dst_image.process_scanline(pScanline))
        return false;
    }
    if (!dst_image.process_scanline(NULL))
      return false;
  }

  dst_image.deinit();

  buf_size = dst_stream.get_size();
  return true;
}